

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

Ccf_Man_t * Ccf_ManStart(Gia_Man_t *pGia,int nFrameMax,int nConfMax,int nTimeMax,int fVerbose)

{
  Ccf_Man_t *pCVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  sat_solver *psVar4;
  Ccf_Man_t *p;
  int fVerbose_local;
  int nTimeMax_local;
  int nConfMax_local;
  int nFrameMax_local;
  Gia_Man_t *pGia_local;
  
  if (0 < nFrameMax) {
    pCVar1 = (Ccf_Man_t *)calloc(1,0x38);
    pCVar1->pGia = pGia;
    pCVar1->nFrameMax = nFrameMax;
    pCVar1->nConfMax = nConfMax;
    pCVar1->nTimeMax = nTimeMax;
    pCVar1->fVerbose = fVerbose;
    memset(Ccf_ManStart::pPars,0,0x18);
    Ccf_ManStart::pPars->fVerbose = fVerbose;
    Ccf_ManStart::pPars->nFrames = nFrameMax;
    Ccf_ManStart::pPars->fSaveLastLit = 1;
    pvVar2 = Gia_ManUnrollStart(pGia,Ccf_ManStart::pPars);
    pCVar1->pUnr = pvVar2;
    pVVar3 = Vec_IntAlloc(1000);
    pCVar1->vCopies = pVVar3;
    psVar4 = sat_solver_new();
    pCVar1->pSat = psVar4;
    return pCVar1;
  }
  __assert_fail("nFrameMax > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCCof.c"
                ,0x42,"Ccf_Man_t *Ccf_ManStart(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Ccf_Man_t * Ccf_ManStart( Gia_Man_t * pGia, int nFrameMax, int nConfMax, int nTimeMax, int fVerbose )
{
    static Gia_ParFra_t Pars, * pPars = &Pars;
    Ccf_Man_t * p;
    assert( nFrameMax > 0 );
    p = ABC_CALLOC( Ccf_Man_t, 1 );
    p->pGia      = pGia;
    p->nFrameMax = nFrameMax;    
    p->nConfMax  = nConfMax;
    p->nTimeMax  = nTimeMax;
    p->fVerbose  = fVerbose;
    // create unrolling manager
    memset( pPars, 0, sizeof(Gia_ParFra_t) );
    pPars->fVerbose     = fVerbose;
    pPars->nFrames      = nFrameMax;
    pPars->fSaveLastLit = 1;
    p->pUnr = Gia_ManUnrollStart( pGia, pPars );
    p->vCopies = Vec_IntAlloc( 1000 );
    // internal data
    p->pSat = sat_solver_new();
//    sat_solver_setnvars( p->pSat, 10000 );
    return p;
}